

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_bin_ugrid(REF_GRID ref_grid,char *filename,REF_BOOL swap,REF_BOOL fat)

{
  char *pcVar1;
  uint uVar2;
  REF_STATUS RVar3;
  size_t sVar4;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  char *yp_2;
  char *xp_2;
  double y_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  char *yp_1;
  char *xp_1;
  double y_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  char *yp;
  char *xp;
  double y;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_INT faceid;
  REF_INT group;
  REF_DBL swapped_dbl;
  REF_INT cell;
  REF_INT node_per;
  REF_INT nodes [27];
  REF_INT *n2o;
  REF_INT *o2n;
  REF_CELL pRStack_40;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file;
  REF_BOOL fat_local;
  REF_BOOL swap_local;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  file._0_4_ = fat;
  file._4_4_ = swap;
  _fat_local = filename;
  filename_local = (char *)ref_grid;
  ref_node = (REF_NODE)fopen(filename,"w");
  if ((FILE *)ref_node == (FILE *)0x0) {
    printf("unable to open %s\n",_fat_local);
  }
  if (ref_node == (REF_NODE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x62d,
           "ref_export_bin_ugrid","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    uVar2 = ref_export_bin_ugrid_int((FILE *)ref_node,file._4_4_,(REF_BOOL)file,ref_cell->type);
    if (uVar2 == 0) {
      uVar2 = ref_export_bin_ugrid_int
                        ((FILE *)ref_node,file._4_4_,(REF_BOOL)file,
                         *(REF_INT *)(*(long *)(filename_local + 0x28) + 0x28));
      if (uVar2 == 0) {
        uVar2 = ref_export_bin_ugrid_int
                          ((FILE *)ref_node,file._4_4_,(REF_BOOL)file,
                           *(REF_INT *)(*(long *)(filename_local + 0x40) + 0x28));
        if (uVar2 == 0) {
          uVar2 = ref_export_bin_ugrid_int
                            ((FILE *)ref_node,file._4_4_,(REF_BOOL)file,
                             *(REF_INT *)(*(long *)(filename_local + 0x50) + 0x28));
          if (uVar2 == 0) {
            uVar2 = ref_export_bin_ugrid_int
                              ((FILE *)ref_node,file._4_4_,(REF_BOOL)file,
                               *(REF_INT *)(*(long *)(filename_local + 0x58) + 0x28));
            if (uVar2 == 0) {
              uVar2 = ref_export_bin_ugrid_int
                                ((FILE *)ref_node,file._4_4_,(REF_BOOL)file,
                                 *(REF_INT *)(*(long *)(filename_local + 0x60) + 0x28));
              if (uVar2 == 0) {
                uVar2 = ref_export_bin_ugrid_int
                                  ((FILE *)ref_node,file._4_4_,(REF_BOOL)file,
                                   *(REF_INT *)(*(long *)(filename_local + 0x68) + 0x28));
                if (uVar2 == 0) {
                  uVar2 = ref_node_compact((REF_NODE)ref_cell,&n2o,(REF_INT **)(nodes + 0x1a));
                  if (uVar2 == 0) {
                    for (o2n._4_4_ = 0; pcVar1 = _faceid, o2n._4_4_ < (int)ref_cell->type;
                        o2n._4_4_ = o2n._4_4_ + 1) {
                      _faceid = *(char **)(ref_cell->c2n +
                                          (long)(*(int *)((long)stack0xffffffffffffffa8 +
                                                         (long)o2n._4_4_ * 4) * 0xf) * 2);
                      if (file._4_4_ != 0) {
                        xp._7_1_ = (undefined1)faceid;
                        faceid._1_1_ = SUB81(pcVar1,1);
                        xp._6_1_ = faceid._1_1_;
                        faceid._2_1_ = SUB81(pcVar1,2);
                        xp._5_1_ = faceid._2_1_;
                        faceid._3_1_ = SUB81(pcVar1,3);
                        xp._4_1_ = faceid._3_1_;
                        group._0_1_ = SUB81(pcVar1,4);
                        xp._3_1_ = (undefined1)group;
                        group._1_1_ = SUB81(pcVar1,5);
                        xp._2_1_ = group._1_1_;
                        group._2_1_ = SUB81(pcVar1,6);
                        xp._1_1_ = group._2_1_;
                        group._3_1_ = SUB81(pcVar1,7);
                        xp._0_1_ = group._3_1_;
                        _faceid = xp;
                      }
                      sVar4 = fwrite(&faceid,8,1,(FILE *)ref_node);
                      pcVar1 = _faceid;
                      if (sVar4 != 1) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x648,"ref_export_bin_ugrid","x",1,sVar4);
                        return 1;
                      }
                      _faceid = *(char **)(ref_cell->c2n +
                                          (long)(*(int *)((long)stack0xffffffffffffffa8 +
                                                         (long)o2n._4_4_ * 4) * 0xf + 1) * 2);
                      if (file._4_4_ != 0) {
                        xp_1._7_1_ = (undefined1)faceid;
                        faceid._1_1_ = SUB81(pcVar1,1);
                        xp_1._6_1_ = faceid._1_1_;
                        faceid._2_1_ = SUB81(pcVar1,2);
                        xp_1._5_1_ = faceid._2_1_;
                        faceid._3_1_ = SUB81(pcVar1,3);
                        xp_1._4_1_ = faceid._3_1_;
                        group._0_1_ = SUB81(pcVar1,4);
                        xp_1._3_1_ = (undefined1)group;
                        group._1_1_ = SUB81(pcVar1,5);
                        xp_1._2_1_ = group._1_1_;
                        group._2_1_ = SUB81(pcVar1,6);
                        xp_1._1_1_ = group._2_1_;
                        group._3_1_ = SUB81(pcVar1,7);
                        xp_1._0_1_ = group._3_1_;
                        _faceid = xp_1;
                      }
                      sVar4 = fwrite(&faceid,8,1,(FILE *)ref_node);
                      if (sVar4 != 1) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x64b,"ref_export_bin_ugrid","y",1,sVar4);
                        return 1;
                      }
                      pcVar1 = *(char **)(ref_cell->c2n +
                                         (long)(*(int *)((long)stack0xffffffffffffffa8 +
                                                        (long)o2n._4_4_ * 4) * 0xf + 2) * 2);
                      _faceid = pcVar1;
                      if (file._4_4_ != 0) {
                        faceid._0_1_ = SUB81(pcVar1,0);
                        xp_2._7_1_ = (undefined1)faceid;
                        faceid._1_1_ = (undefined1)((ulong)pcVar1 >> 8);
                        xp_2._6_1_ = faceid._1_1_;
                        faceid._2_1_ = (undefined1)((ulong)pcVar1 >> 0x10);
                        xp_2._5_1_ = faceid._2_1_;
                        faceid._3_1_ = (undefined1)((ulong)pcVar1 >> 0x18);
                        xp_2._4_1_ = faceid._3_1_;
                        group._0_1_ = (undefined1)((ulong)pcVar1 >> 0x20);
                        xp_2._3_1_ = (undefined1)group;
                        group._1_1_ = (undefined1)((ulong)pcVar1 >> 0x28);
                        xp_2._2_1_ = group._1_1_;
                        group._2_1_ = (undefined1)((ulong)pcVar1 >> 0x30);
                        xp_2._1_1_ = group._2_1_;
                        group._3_1_ = (undefined1)((ulong)pcVar1 >> 0x38);
                        xp_2._0_1_ = group._3_1_;
                        _faceid = xp_2;
                      }
                      sVar4 = fwrite(&faceid,8,1,(FILE *)ref_node);
                      if (sVar4 != 1) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x64e,"ref_export_bin_ugrid","z",1,sVar4);
                        return 1;
                      }
                    }
                    uVar2 = ref_export_faceid_range
                                      ((REF_GRID)filename_local,&ref_private_macro_code_rss,
                                       &ref_private_macro_code_rss_1);
                    if (uVar2 == 0) {
                      pRStack_40 = *(REF_CELL *)(filename_local + 0x28);
                      swapped_dbl._4_4_ = pRStack_40->node_per;
                      for (max_faceid = ref_private_macro_code_rss;
                          max_faceid <= ref_private_macro_code_rss_1; max_faceid = max_faceid + 1) {
                        for (swapped_dbl._0_4_ = 0; swapped_dbl._0_4_ < pRStack_40->max;
                            swapped_dbl._0_4_ = swapped_dbl._0_4_ + 1) {
                          RVar3 = ref_cell_nodes(pRStack_40,swapped_dbl._0_4_,&cell);
                          if ((RVar3 == 0) && ((&cell)[swapped_dbl._4_4_] == max_faceid)) {
                            for (o2n._4_4_ = 0; o2n._4_4_ < swapped_dbl._4_4_;
                                o2n._4_4_ = o2n._4_4_ + 1) {
                              (&cell)[o2n._4_4_] = n2o[(&cell)[o2n._4_4_]] + 1;
                              uVar2 = ref_export_bin_ugrid_int
                                                ((FILE *)ref_node,file._4_4_,(REF_BOOL)file,
                                                 (&cell)[o2n._4_4_]);
                              if (uVar2 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                       ,0x65a,"ref_export_bin_ugrid",(ulong)uVar2,"c2n");
                                return uVar2;
                              }
                            }
                          }
                        }
                      }
                      pRStack_40 = *(REF_CELL *)(filename_local + 0x40);
                      swapped_dbl._4_4_ = pRStack_40->node_per;
                      for (max_faceid = ref_private_macro_code_rss;
                          max_faceid <= ref_private_macro_code_rss_1; max_faceid = max_faceid + 1) {
                        for (swapped_dbl._0_4_ = 0; swapped_dbl._0_4_ < pRStack_40->max;
                            swapped_dbl._0_4_ = swapped_dbl._0_4_ + 1) {
                          RVar3 = ref_cell_nodes(pRStack_40,swapped_dbl._0_4_,&cell);
                          if ((RVar3 == 0) && ((&cell)[swapped_dbl._4_4_] == max_faceid)) {
                            for (o2n._4_4_ = 0; o2n._4_4_ < swapped_dbl._4_4_;
                                o2n._4_4_ = o2n._4_4_ + 1) {
                              (&cell)[o2n._4_4_] = n2o[(&cell)[o2n._4_4_]] + 1;
                              uVar2 = ref_export_bin_ugrid_int
                                                ((FILE *)ref_node,file._4_4_,(REF_BOOL)file,
                                                 (&cell)[o2n._4_4_]);
                              if (uVar2 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                       ,0x667,"ref_export_bin_ugrid",(ulong)uVar2,"c2n");
                                return uVar2;
                              }
                            }
                          }
                        }
                      }
                      pRStack_40 = *(REF_CELL *)(filename_local + 0x28);
                      swapped_dbl._4_4_ = pRStack_40->node_per;
                      for (max_faceid = ref_private_macro_code_rss;
                          max_faceid <= ref_private_macro_code_rss_1; max_faceid = max_faceid + 1) {
                        for (swapped_dbl._0_4_ = 0; swapped_dbl._0_4_ < pRStack_40->max;
                            swapped_dbl._0_4_ = swapped_dbl._0_4_ + 1) {
                          RVar3 = ref_cell_nodes(pRStack_40,swapped_dbl._0_4_,&cell);
                          if (((RVar3 == 0) && ((&cell)[swapped_dbl._4_4_] == max_faceid)) &&
                             (uVar2 = ref_export_bin_ugrid_int
                                                ((FILE *)ref_node,file._4_4_,(REF_BOOL)file,nodes[1]
                                                ), uVar2 != 0)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                   ,0x672,"ref_export_bin_ugrid",(ulong)uVar2,"c2n");
                            return uVar2;
                          }
                        }
                      }
                      pRStack_40 = *(REF_CELL *)(filename_local + 0x40);
                      swapped_dbl._4_4_ = pRStack_40->node_per;
                      for (max_faceid = ref_private_macro_code_rss;
                          max_faceid <= ref_private_macro_code_rss_1; max_faceid = max_faceid + 1) {
                        for (swapped_dbl._0_4_ = 0; swapped_dbl._0_4_ < pRStack_40->max;
                            swapped_dbl._0_4_ = swapped_dbl._0_4_ + 1) {
                          RVar3 = ref_cell_nodes(pRStack_40,swapped_dbl._0_4_,&cell);
                          if (((RVar3 == 0) && ((&cell)[swapped_dbl._4_4_] == max_faceid)) &&
                             (uVar2 = ref_export_bin_ugrid_int
                                                ((FILE *)ref_node,file._4_4_,(REF_BOOL)file,nodes[2]
                                                ), uVar2 != 0)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                   ,0x67c,"ref_export_bin_ugrid",(ulong)uVar2,"c2n");
                            return uVar2;
                          }
                        }
                      }
                      min_faceid = 8;
                      pRStack_40 = *(REF_CELL *)(filename_local + 0x50);
                      while (min_faceid < 0x10) {
                        swapped_dbl._4_4_ = pRStack_40->node_per;
                        for (swapped_dbl._0_4_ = 0; swapped_dbl._0_4_ < pRStack_40->max;
                            swapped_dbl._0_4_ = swapped_dbl._0_4_ + 1) {
                          RVar3 = ref_cell_nodes(pRStack_40,swapped_dbl._0_4_,&cell);
                          if (RVar3 == 0) {
                            for (o2n._4_4_ = 0; o2n._4_4_ < swapped_dbl._4_4_;
                                o2n._4_4_ = o2n._4_4_ + 1) {
                              (&cell)[o2n._4_4_] = n2o[(&cell)[o2n._4_4_]] + 1;
                              uVar2 = ref_export_bin_ugrid_int
                                                ((FILE *)ref_node,file._4_4_,(REF_BOOL)file,
                                                 (&cell)[o2n._4_4_]);
                              if (uVar2 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                       ,0x686,"ref_export_bin_ugrid",(ulong)uVar2,"c2n");
                                return uVar2;
                              }
                            }
                          }
                        }
                        min_faceid = min_faceid + 1;
                        pRStack_40 = *(REF_CELL *)(filename_local + (long)min_faceid * 8 + 0x10);
                      }
                      if (stack0xffffffffffffffa8 != (void *)0x0) {
                        free(stack0xffffffffffffffa8);
                      }
                      if (n2o != (REF_INT *)0x0) {
                        free(n2o);
                      }
                      fclose((FILE *)ref_node);
                      ref_grid_local._4_4_ = 0;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x651,"ref_export_bin_ugrid",(ulong)uVar2,"range");
                      ref_grid_local._4_4_ = uVar2;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                           ,0x643,"ref_export_bin_ugrid",(ulong)uVar2,"compact");
                    ref_grid_local._4_4_ = uVar2;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x641,"ref_export_bin_ugrid",(ulong)uVar2,"nhex");
                  ref_grid_local._4_4_ = uVar2;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x63e,"ref_export_bin_ugrid",(ulong)uVar2,"npri");
                ref_grid_local._4_4_ = uVar2;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x63b,"ref_export_bin_ugrid",(ulong)uVar2,"npyr");
              ref_grid_local._4_4_ = uVar2;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x638,"ref_export_bin_ugrid",(ulong)uVar2,"ntet");
            ref_grid_local._4_4_ = uVar2;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x635,"ref_export_bin_ugrid",(ulong)uVar2,"nqua");
          ref_grid_local._4_4_ = uVar2;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x632,"ref_export_bin_ugrid",(ulong)uVar2,"ntri");
        ref_grid_local._4_4_ = uVar2;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x62f,"ref_export_bin_ugrid",(ulong)uVar2,"nnode");
      ref_grid_local._4_4_ = uVar2;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_bin_ugrid(REF_GRID ref_grid,
                                               const char *filename,
                                               REF_BOOL swap, REF_BOOL fat) {
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per, cell;
  REF_DBL swapped_dbl;
  REF_INT group;
  REF_INT faceid, min_faceid, max_faceid;

  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RSS(ref_export_bin_ugrid_int(file, swap, fat, ref_node_n(ref_node)), "nnode");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_tri(ref_grid))),
      "ntri");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_qua(ref_grid))),
      "nqua");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_tet(ref_grid))),
      "ntet");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_pyr(ref_grid))),
      "npyr");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_pri(ref_grid))),
      "npri");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_hex(ref_grid))),
      "nhex");

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  for (node = 0; node < ref_node_n(ref_node); node++) {
    swapped_dbl = ref_node_xyz(ref_node, 0, n2o[node]);
    if (swap) SWAP_DBL(swapped_dbl);
    REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "x");
    swapped_dbl = ref_node_xyz(ref_node, 1, n2o[node]);
    if (swap) SWAP_DBL(swapped_dbl);
    REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "y");
    swapped_dbl = ref_node_xyz(ref_node, 2, n2o[node]);
    if (swap) SWAP_DBL(swapped_dbl);
    REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "z");
  }

  RSS(ref_export_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        for (node = 0; node < node_per; node++) {
          nodes[node] = o2n[nodes[node]] + 1;
          RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[node]), "c2n");
        }
      }
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        for (node = 0; node < node_per; node++) {
          nodes[node] = o2n[nodes[node]] + 1;
          RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[node]), "c2n");
        }
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[3]), "c2n");
      }
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[4]), "c2n");
      }
    }
  }

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    node_per = ref_cell_node_per(ref_cell);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      for (node = 0; node < node_per; node++) {
        nodes[node] = o2n[nodes[node]] + 1;
        RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[node]), "c2n");
      }
    }
  }

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}